

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::Material::Material
          (Material *this,uint64_t id,Element *element,Document *doc,string *name)

{
  pointer pcVar1;
  size_type sVar2;
  Connection *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar3;
  int iVar4;
  Scope *this_01;
  Element *el;
  Element *el_00;
  Token *pTVar5;
  Object *pOVar6;
  mapped_type pTVar7;
  iterator iVar8;
  mapped_type *ppTVar9;
  LayeredTexture *this_02;
  iterator iVar10;
  mapped_type *ppLVar11;
  Token *t;
  pointer ppCVar12;
  Document *doc_00;
  size_type sVar13;
  string *prop;
  string *psVar14;
  string templateName;
  allocator local_d1;
  Element *local_d0;
  string local_c8;
  Document *local_a8;
  LayeredTextureMap *local_a0;
  TextureMap *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  Material *local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  pointer local_50;
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_48;
  
  local_a8 = doc;
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Material_00245cb8;
  (this->shading)._M_dataplus._M_p = (pointer)&(this->shading).field_2;
  (this->shading)._M_string_length = 0;
  (this->shading).field_2._M_local_buf[0] = '\0';
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  psVar14 = &this->shading;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98 = &this->textures;
  local_58 = &(this->textures)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_58;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_58;
  (this->textures)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0 = &this->layeredTextures;
  local_60 = &(this->layeredTextures)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->layeredTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->layeredTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->layeredTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_60;
  (this->layeredTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_60;
  (this->layeredTextures)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0 = element;
  local_70 = psVar14;
  local_68 = this;
  this_01 = GetRequiredScope(element);
  std::__cxx11::string::string((string *)&local_c8,"ShadingModel",(allocator *)&local_90);
  el = Scope::operator[](this_01,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string((string *)&local_c8,"MultiLayer",(allocator *)&local_90);
  el_00 = Scope::operator[](this_01,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  if (el_00 != (Element *)0x0) {
    pTVar5 = GetRequiredToken(el_00,0);
    iVar4 = ParseTokenAsInt(pTVar5);
    this->multilayer = iVar4 != 0;
  }
  if (el == (Element *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_c8,"shading mode not specified, assuming phong",
               (allocator *)&local_90);
    Util::DOMWarning(&local_c8,local_d0);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::assign((char *)psVar14);
  }
  else {
    pTVar5 = GetRequiredToken(el,0);
    ParseTokenAsString_abi_cxx11_(&local_c8,(FBX *)pTVar5,t);
    std::__cxx11::string::operator=((string *)psVar14,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  pcVar1 = (this->shading)._M_dataplus._M_p;
  sVar2 = (this->shading)._M_string_length;
  for (sVar13 = 0; __lhs = local_70, sVar2 != sVar13; sVar13 = sVar13 + 1) {
    iVar4 = tolower((int)pcVar1[sVar13]);
    pcVar1[sVar13] = (char)iVar4;
  }
  bVar3 = std::operator==(local_70,"phong");
  if ((bVar3) || (bVar3 = std::operator==(__lhs,"lambert"), doc_00 = local_a8, bVar3)) {
    doc_00 = local_a8;
    std::__cxx11::string::assign((char *)&local_c8);
  }
  else {
    std::operator+(&local_90,"shading mode not recognized: ",__lhs);
    Util::DOMWarning(&local_90,local_d0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  Util::GetPropertyTable((Util *)&local_90,doc_00,&local_c8,local_d0,this_01,false);
  std::__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->props).
              super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2> *)&local_90
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90._M_string_length);
  Document::GetConnectionsByDestinationSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&local_48,doc_00,(this->super_Object).id);
  local_50 = local_48._M_impl.super__Vector_impl_data._M_finish;
  ppCVar12 = local_48._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppCVar12 == local_50) {
      std::
      _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ::~_Vector_base(&local_48);
      std::__cxx11::string::~string((string *)&local_c8);
      return;
    }
    this_00 = *ppCVar12;
    if ((this_00->prop)._M_string_length != 0) {
      pOVar6 = Connection::SourceObject(this_00);
      if (pOVar6 == (Object *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_90,"failed to read source object for texture link, ignoring",
                   &local_d1);
        Util::DOMWarning(&local_90,local_d0);
LAB_001747b5:
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        psVar14 = &this_00->prop;
        pTVar7 = (mapped_type)__dynamic_cast(pOVar6,&Object::typeinfo,&Texture::typeinfo,0);
        if (pTVar7 == (mapped_type)0x0) {
          this_02 = (LayeredTexture *)
                    __dynamic_cast(pOVar6,&Object::typeinfo,&LayeredTexture::typeinfo,0);
          if (this_02 == (LayeredTexture *)0x0) {
            std::__cxx11::string::string
                      ((string *)&local_90,
                       "source object for texture link is not a texture or layered texture, ignoring"
                       ,&local_d1);
            Util::DOMWarning(&local_90,local_d0);
            goto LAB_001747b5;
          }
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>_>
                   ::find(&local_a0->_M_t,psVar14);
          if (iVar10._M_node != local_60) {
            std::operator+(&local_90,"duplicate layered texture link: ",psVar14);
            Util::DOMWarning(&local_90,local_d0);
            std::__cxx11::string::~string((string *)&local_90);
          }
          ppLVar11 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>_>
                     ::operator[](local_a0,psVar14);
          *ppLVar11 = this_02;
          LayeredTexture::fillTexture(this_02,local_a8);
        }
        else {
          iVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>_>
                  ::find(&local_98->_M_t,psVar14);
          if (iVar8._M_node != local_58) {
            std::operator+(&local_90,"duplicate texture link: ",psVar14);
            Util::DOMWarning(&local_90,local_d0);
            std::__cxx11::string::~string((string *)&local_90);
          }
          ppTVar9 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>_>
                    ::operator[](local_98,psVar14);
          *ppTVar9 = pTVar7;
        }
      }
    }
    ppCVar12 = ppCVar12 + 1;
  } while( true );
}

Assistant:

Material::Material(uint64_t id, const Element& element, const Document& doc, const std::string& name)
: Object(id,element,name)
{
    const Scope& sc = GetRequiredScope(element);

    const Element* const ShadingModel = sc["ShadingModel"];
    const Element* const MultiLayer = sc["MultiLayer"];

    if(MultiLayer) {
        multilayer = !!ParseTokenAsInt(GetRequiredToken(*MultiLayer,0));
    }

    if(ShadingModel) {
        shading = ParseTokenAsString(GetRequiredToken(*ShadingModel,0));
    }
    else {
        DOMWarning("shading mode not specified, assuming phong",&element);
        shading = "phong";
    }

    std::string templateName;

    // lower-case shading because Blender (for example) writes "Phong"
    std::transform(shading.begin(), shading.end(), shading.begin(), ::tolower);
    if(shading == "phong") {
        templateName = "Material.FbxSurfacePhong";
    }
    else if(shading == "lambert") {
        templateName = "Material.FbxSurfaceLambert";
    }
    else {
        DOMWarning("shading mode not recognized: " + shading,&element);
    }

    props = GetPropertyTable(doc,templateName,element,sc);

    // resolve texture links
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID());
    for(const Connection* con : conns) {

        // texture link to properties, not objects
        if (!con->PropertyName().length()) {
            continue;
        }

        const Object* const ob = con->SourceObject();
        if(!ob) {
            DOMWarning("failed to read source object for texture link, ignoring",&element);
            continue;
        }

        const Texture* const tex = dynamic_cast<const Texture*>(ob);
        if(!tex) {
            const LayeredTexture* const layeredTexture = dynamic_cast<const LayeredTexture*>(ob);
            if(!layeredTexture) {
                DOMWarning("source object for texture link is not a texture or layered texture, ignoring",&element);
                continue;
            }
            const std::string& prop = con->PropertyName();
            if (layeredTextures.find(prop) != layeredTextures.end()) {
                DOMWarning("duplicate layered texture link: " + prop,&element);
            }

            layeredTextures[prop] = layeredTexture;
            ((LayeredTexture*)layeredTexture)->fillTexture(doc);
        }
        else
        {
            const std::string& prop = con->PropertyName();
            if (textures.find(prop) != textures.end()) {
                DOMWarning("duplicate texture link: " + prop,&element);
            }

            textures[prop] = tex;
        }

    }
}